

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_util.c
# Opt level: O2

int psa_status_to_mbedtls
              (psa_status_t status,mbedtls_error_pair_t *local_translations,size_t local_errors_num,
              _func_int_psa_status_t *fallback_f)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = 0;
  while( true ) {
    if (local_errors_num == sVar2) {
      iVar1 = (*fallback_f)(status);
      return iVar1;
    }
    if (local_translations[sVar2].psa_status == status) break;
    sVar2 = sVar2 + 1;
  }
  return (int)local_translations[sVar2].mbedtls_error;
}

Assistant:

int psa_status_to_mbedtls(psa_status_t status,
                          const mbedtls_error_pair_t *local_translations,
                          size_t local_errors_num,
                          int (*fallback_f)(psa_status_t))
{
    for (size_t i = 0; i < local_errors_num; i++) {
        if (status == local_translations[i].psa_status) {
            return local_translations[i].mbedtls_error;
        }
    }
    return fallback_f(status);
}